

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenberg_marquardt.cpp
# Opt level: O1

int __thiscall SimpleLineFunctor::operator()(SimpleLineFunctor *this,VectorXd *z,VectorXd *fvec)

{
  pointer pMVar1;
  long lVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  
  pMVar1 = (this->Points).
           super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->Points).
                super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1;
  if (lVar5 != 0) {
    lVar2 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if ((lVar2 < 1) || (lVar2 == 1)) {
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                   );
    }
    pdVar3 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar4 = (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    lVar2 = (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    uVar6 = 1;
    uVar7 = 0;
    do {
      if (lVar2 <= (long)uVar7) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      pdVar4[uVar7] =
           *(double *)
            ((long)&pMVar1[uVar7].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                    m_storage.m_data + 8) -
           (*pdVar3 * pMVar1[uVar7].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                      m_storage.m_data.array[0] + pdVar3[1]);
      uVar7 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar7 < (ulong)(lVar5 >> 4));
  }
  return 0;
}

Assistant:

int operator()(const Eigen::VectorXd &z, Eigen::VectorXd &fvec) const
    {
        // "a" in the model is z(0), and "b" is z(1)
        double x_i,y_i,a,b;
        for(unsigned int i = 0; i < this->Points.size(); ++i)
        {
            y_i=this->Points[i](1);
            x_i=this->Points[i](0);
            a=z(0);
            b=z(1);
            fvec(i) =y_i-(a*x_i +b);
        }

        return 0;
    }